

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::abortNotInLoopThread(EventLoop *this)

{
  sz_pid_t v;
  LogStream *pLVar1;
  self *psVar2;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  EventLoop *local_10;
  EventLoop *this_local;
  
  local_10 = this;
  Logger::SourceFile::SourceFile<100>
            ((SourceFile *)local_ff0,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_ff0._0_8_;
  file.m_size = local_ff0._8_4_;
  Logger::Logger(&local_fe0,file,0xe7,FATAL);
  pLVar1 = Logger::stream(&local_fe0);
  psVar2 = LogStream::operator<<(pLVar1,"EventLoop::abortNotInLoopThread - EventLoop ");
  pLVar1 = LogStream::operator<<(psVar2,this);
  psVar2 = LogStream::operator<<(pLVar1," was created in m_threadId = ");
  pLVar1 = LogStream::operator<<(psVar2,this->m_threadId);
  psVar2 = LogStream::operator<<(pLVar1,", current thread id = ");
  v = CurrentThread::tid();
  LogStream::operator<<(psVar2,v);
  Logger::~Logger(&local_fe0);
  return;
}

Assistant:

void EventLoop::abortNotInLoopThread()
{
	LOG_FATAL << "EventLoop::abortNotInLoopThread - EventLoop " << this
		<< " was created in m_threadId = " << m_threadId
		<< ", current thread id = " << CurrentThread::tid();
}